

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O0

void density_tests::heterogeneous_queue_put_samples(void)

{
  int *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  put_transaction<void> local_290;
  undefined1 local_278 [8];
  put_transaction<void> put_4;
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_5;
  string local_250 [8];
  string source_3;
  undefined1 local_230 [8];
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_6;
  undefined1 local_208 [8];
  put_transaction<void> put_3;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_4;
  string local_1e0 [8];
  string source_2;
  undefined1 local_1c0 [8];
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_5;
  undefined1 local_198 [8];
  put_transaction<void> put_2;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_3;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_4;
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_2;
  string local_158 [8];
  string source_1;
  undefined1 local_138 [8];
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_3;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_1;
  string local_118 [8];
  string source;
  undefined1 local_f8 [8];
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_2;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue_1;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined1 local_b0 [8];
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  put_1;
  put_transaction<int> local_90;
  undefined1 local_78 [8];
  put_transaction<int> put;
  int local_58;
  allocator local_51;
  string local_50 [52];
  int local_1c;
  undefined1 local_18 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_18);
  local_1c = 0xc;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_18,&local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Hello world!!",&local_51);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  push<std::__cxx11::string>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
  ;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  emplace<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_18);
  local_58 = 0xc;
  put.m_put_data.m_user_storage._7_1_ = 0x2d;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_18,&local_58,(char *)((long)&put.m_put_data.m_user_storage + 7));
  put_1.m_put_data.m_user_storage._4_4_ = 0xc;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_90,
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_18,(int *)((long)&put_1.m_put_data.m_user_storage + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)local_78,&local_90);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_90);
  piVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<int>::element<int,_nullptr>((put_transaction<int> *)local_78);
  *piVar1 = *piVar1 + 2;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_78);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_78);
  queue_1.m_tail._4_4_ = 4;
  queue_1.m_tail._3_1_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<std::__cxx11::string,int,char>
            (&local_c8,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_18,(int *)((long)&queue_1.m_tail + 4),(char *)((long)&queue_1.m_tail + 3));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<std::__cxx11::string>::put_transaction<std::__cxx11::string,void>
            ((put_transaction<std::__cxx11::string> *)local_b0,&local_c8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_c8);
  this = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::
         element<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                   ((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_b0);
  std::__cxx11::string::operator+=((string *)this,"****");
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::commit((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_18);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)&type);
  queue_2.m_tail =
       (ControlBlock *)
       density::
       runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       ::make<int>();
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)&type,(runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                       *)&queue_2.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)&type);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,"Hello world!!",(allocator *)((long)&type_1.m_feature_table + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&type_1.m_feature_table + 7));
  queue_3.m_tail =
       (ControlBlock *)
       density::
       runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string_const>();
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)local_f8,
                  (runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&queue_3.m_tail,local_118);
  std::__cxx11::string::~string(local_118);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)local_f8);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"Hello world!!",(allocator *)((long)&type_2.m_feature_table + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&type_2.m_feature_table + 7));
  queue_4.m_tail =
       (ControlBlock *)
       density::
       runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>
       ::make<std::__cxx11::string>();
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)local_138,
                  (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&queue_4.m_tail,local_158);
  std::__cxx11::string::~string(local_158);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)local_138);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)&type_3);
  put_2.m_put_data.m_user_storage =
       (void *)density::
               runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
               ::make<int>();
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push((put_transaction<void> *)&queue_5.m_tail,
                   (heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                    *)&type_3,
                   (runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                    *)&put_2.m_put_data.m_user_storage);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
  ::put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)local_198,(put_transaction<void> *)&queue_5.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&queue_5.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)local_198);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)local_198);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)&type_3);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,"Hello world!!",(allocator *)((long)&type_4.m_feature_table + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&type_4.m_feature_table + 7));
  put_3.m_put_data.m_user_storage =
       (void *)density::
               runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>
               ::make<std::__cxx11::string_const>();
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_copy
            ((put_transaction<void> *)&queue_6.m_tail,
             (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)local_1c0,
             (runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&put_3.m_put_data.m_user_storage,local_1e0);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
  ::put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)local_208,(put_transaction<void> *)&queue_6.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&queue_6.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)local_208);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)local_208);
  std::__cxx11::string::~string(local_1e0);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)local_1c0);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                 *)local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_250,"Hello world!!",(allocator *)((long)&type_5.m_feature_table + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&type_5.m_feature_table + 7));
  put_4.m_put_data.m_user_storage =
       (void *)density::
               runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>
               ::make<std::__cxx11::string>();
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_move
            (&local_290,
             (heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)local_230,
             (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&put_4.m_put_data.m_user_storage,local_250);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
  ::put_transaction<void>::put_transaction<void,void>((put_transaction<void> *)local_278,&local_290)
  ;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction(&local_290);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)local_278);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)local_278);
  std::__cxx11::string::~string(local_250);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                  *)local_230);
  return;
}

Assistant:

void heterogeneous_queue_put_samples()
    {
        using namespace density;
        {
            heter_queue<> queue;

            //! [heter_queue push example 1]
            queue.push(12);
            queue.push(std::string("Hello world!!"));
            //! [heter_queue push example 1]

            //! [heter_queue emplace example 1]
            queue.emplace<int>();
            queue.emplace<std::string>(12, '-');
            //! [heter_queue emplace example 1]

            {
                //! [heter_queue start_push example 1]
                auto put = queue.start_push(12);
                put.element() += 2;
                put.commit(); // commits a 14
                //! [heter_queue start_push example 1]
            }
            {
                //! [heter_queue start_emplace example 1]
                auto put = queue.start_emplace<std::string>(4, '*');
                put.element() += "****";
                put.commit(); // commits a "********"
                //! [heter_queue start_emplace example 1]
            }
        }
        {
            //! [heter_queue dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            queue.dyn_push(type); // appends 0
            //! [heter_queue dyn_push example 1]
        }
        {
            //! [heter_queue dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_copy(type, &source);
            //! [heter_queue dyn_push_copy example 1]
        }
        {
            //! [heter_queue dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_move(type, &source);
            //! [heter_queue dyn_push_move example 1]
        }

        {
            //! [heter_queue start_dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            auto       put  = queue.start_dyn_push(type);
            put.commit();
            //! [heter_queue start_dyn_push example 1]
        }
        {
            //! [heter_queue start_dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            auto              put  = queue.start_dyn_push_copy(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_copy example 1]
        }
        {
            //! [heter_queue start_dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            auto        put  = queue.start_dyn_push_move(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_move example 1]
        }
    }